

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_models.cpp
# Opt level: O0

void gl_RenderHUDModel(DPSprite *psp,float ofsX,float ofsY)

{
  ushort uVar1;
  bool bVar2;
  int iVar3;
  AActor *pAVar4;
  MetaClass *pMVar5;
  FState *pFVar6;
  FSpriteModelFrame *smf_00;
  FSpriteModelFrame *smf;
  AActor *playermo;
  float ofsY_local;
  float ofsX_local;
  DPSprite *psp_local;
  
  pAVar4 = TObjPtr::operator_cast_to_AActor_
                     ((TObjPtr *)(&DAT_00d635d8 + (long)consoleplayer * 0x2a0));
  pMVar5 = AWeapon::GetClass(pAVar4->player->ReadyWeapon);
  pFVar6 = DPSprite::GetState(psp);
  uVar1 = pFVar6->sprite;
  pFVar6 = DPSprite::GetState(psp);
  iVar3 = FState::GetFrame(pFVar6);
  smf_00 = gl_FindModelFrame((PClass *)pMVar5,(uint)uVar1,iVar3,false);
  if (smf_00 != (FSpriteModelFrame *)0x0) {
    (*_ptrc_glDepthFunc)(0x203);
    bVar2 = FRenderStyle::operator==
                      ((FRenderStyle *)&(pAVar4->RenderStyle).field_0,LegacyRenderStyles + 1);
    if (!bVar2) {
      (*_ptrc_glEnable)(0xb44);
      (*_ptrc_glFrontFace)(0x901);
    }
    VSMatrix::loadIdentity(&gl_RenderState.mViewMatrix);
    VSMatrix::scale(&gl_RenderState.mViewMatrix,smf_00->xscale,smf_00->zscale,smf_00->yscale);
    VSMatrix::translate(&gl_RenderState.mViewMatrix,smf_00->xoffset / smf_00->xscale,
                        smf_00->zoffset / smf_00->zscale,smf_00->yoffset / smf_00->yscale);
    VSMatrix::rotate(&gl_RenderState.mViewMatrix,ofsX / 4.0,0.0,1.0,0.0);
    VSMatrix::rotate(&gl_RenderState.mViewMatrix,(ofsY - 32.375) / -4.0,1.0,0.0,0.0);
    VSMatrix::rotate(&gl_RenderState.mViewMatrix,90.0,0.0,1.0,0.0);
    VSMatrix::rotate(&gl_RenderState.mViewMatrix,-smf_00->angleoffset,0.0,1.0,0.0);
    VSMatrix::rotate(&gl_RenderState.mViewMatrix,smf_00->pitchoffset,0.0,0.0,1.0);
    VSMatrix::rotate(&gl_RenderState.mViewMatrix,-smf_00->rolloffset,1.0,0.0,0.0);
    FRenderState::ApplyMatrices(&gl_RenderState);
    pFVar6 = DPSprite::GetState(psp);
    iVar3 = DPSprite::GetTics(psp);
    pMVar5 = AWeapon::GetClass(pAVar4->player->ReadyWeapon);
    gl_RenderFrameModels(smf_00,pFVar6,iVar3,(PClass *)pMVar5,(Matrix3x4 *)0x0,0);
    (*_ptrc_glDepthFunc)(0x201);
    bVar2 = FRenderStyle::operator==
                      ((FRenderStyle *)&(pAVar4->RenderStyle).field_0,LegacyRenderStyles + 1);
    if (!bVar2) {
      (*_ptrc_glDisable)(0xb44);
    }
  }
  return;
}

Assistant:

void gl_RenderHUDModel(DPSprite *psp, float ofsX, float ofsY)
{
	AActor * playermo=players[consoleplayer].camera;
	FSpriteModelFrame *smf = gl_FindModelFrame(playermo->player->ReadyWeapon->GetClass(), psp->GetState()->sprite, psp->GetState()->GetFrame(), false);

	// [BB] No model found for this sprite, so we can't render anything.
	if ( smf == nullptr )
		return;

	glDepthFunc(GL_LEQUAL);

	// [BB] In case the model should be rendered translucent, do back face culling.
	// This solves a few of the problems caused by the lack of depth sorting.
	// TO-DO: Implement proper depth sorting.
	if (!( playermo->RenderStyle == LegacyRenderStyles[STYLE_Normal] ))
	{
		glEnable(GL_CULL_FACE);
		glFrontFace(GL_CCW);
	}

	// [BB] The model has to be drawn independently from the position of the player,
	// so we have to reset the view matrix.
	gl_RenderState.mViewMatrix.loadIdentity();

	// Scaling model (y scale for a sprite means height, i.e. z in the world!).
	gl_RenderState.mViewMatrix.scale(smf->xscale, smf->zscale, smf->yscale);
	
	// Aplying model offsets (model offsets do not depend on model scalings).
	gl_RenderState.mViewMatrix.translate(smf->xoffset / smf->xscale, smf->zoffset / smf->zscale, smf->yoffset / smf->yscale);

	// [BB] Weapon bob, very similar to the normal Doom weapon bob.
	gl_RenderState.mViewMatrix.rotate(ofsX/4, 0, 1, 0);
	gl_RenderState.mViewMatrix.rotate((ofsY-WEAPONTOP)/-4., 1, 0, 0);

	// [BB] For some reason the jDoom models need to be rotated.
	gl_RenderState.mViewMatrix.rotate(90.f, 0, 1, 0);

	// Applying angleoffset, pitchoffset, rolloffset.
	gl_RenderState.mViewMatrix.rotate(-smf->angleoffset, 0, 1, 0);
	gl_RenderState.mViewMatrix.rotate(smf->pitchoffset, 0, 0, 1);
	gl_RenderState.mViewMatrix.rotate(-smf->rolloffset, 1, 0, 0);
	gl_RenderState.ApplyMatrices();

	gl_RenderFrameModels( smf, psp->GetState(), psp->GetTics(), playermo->player->ReadyWeapon->GetClass(), nullptr, 0 );

	glDepthFunc(GL_LESS);
	if (!( playermo->RenderStyle == LegacyRenderStyles[STYLE_Normal] ))
		glDisable(GL_CULL_FACE);
}